

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-pending-on-close.c
# Opt level: O3

int run_test_signal_close_loop_alive(void)

{
  int iVar1;
  uv_pid_t pid;
  int extraout_EAX;
  int extraout_EAX_00;
  long *plVar2;
  int64_t eval_b;
  int64_t eval_a;
  long local_18;
  long local_10;
  
  iVar1 = uv_loop_init(&loop);
  local_10 = (long)iVar1;
  local_18 = 0;
  if (local_10 == 0) {
    iVar1 = uv_signal_init(&loop,&signal_hdl);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001b96c0;
    iVar1 = uv_signal_start(&signal_hdl,stop_loop_cb,0xd);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001b96cd;
    uv_unref((uv_handle_t *)&signal_hdl);
    pid = uv_os_getpid();
    iVar1 = uv_kill(pid,0xd);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001b96da;
    iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001b96e7;
    uv_close((uv_handle_t *)&signal_hdl,close_cb);
    local_10 = 1;
    iVar1 = uv_loop_alive(&loop);
    local_18 = (long)iVar1;
    if (local_10 != local_18) goto LAB_001b96f4;
    iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001b9701;
    local_10 = 1;
    local_18 = (long)close_cb_called;
    if (local_18 == 1) {
      uv_walk(&loop,close_walk_cb,(void *)0x0);
      uv_run(&loop,UV_RUN_DEFAULT);
      local_10 = 0;
      iVar1 = uv_loop_close(&loop);
      local_18 = (long)iVar1;
      if (local_10 == local_18) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b971b;
    }
  }
  else {
    run_test_signal_close_loop_alive_cold_1();
LAB_001b96c0:
    run_test_signal_close_loop_alive_cold_2();
LAB_001b96cd:
    run_test_signal_close_loop_alive_cold_3();
LAB_001b96da:
    run_test_signal_close_loop_alive_cold_4();
LAB_001b96e7:
    run_test_signal_close_loop_alive_cold_5();
LAB_001b96f4:
    run_test_signal_close_loop_alive_cold_6();
LAB_001b9701:
    run_test_signal_close_loop_alive_cold_7();
  }
  run_test_signal_close_loop_alive_cold_8();
LAB_001b971b:
  iVar1 = (int)&local_18;
  plVar2 = &local_10;
  run_test_signal_close_loop_alive_cold_9();
  if (iVar1 == 0xd) {
    uv_stop((uv_loop_t *)plVar2[1]);
    return extraout_EAX;
  }
  stop_loop_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(signal_close_loop_alive) {
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_signal_init(&loop, &signal_hdl));
  ASSERT_OK(uv_signal_start(&signal_hdl, stop_loop_cb, SIGPIPE));
  uv_unref((uv_handle_t*) &signal_hdl);

  ASSERT_OK(uv_kill(uv_os_getpid(), SIGPIPE));
  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  uv_close((uv_handle_t*) &signal_hdl, close_cb);
  ASSERT_EQ(1, uv_loop_alive(&loop));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}